

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

uint32_t cab_checksum_cfdata_4(void *p,size_t bytes,uint32_t seed)

{
  uint32_t uVar1;
  undefined4 local_30;
  undefined4 local_2c;
  uint32_t sum;
  uint u32num;
  uchar *b;
  uint32_t seed_local;
  size_t bytes_local;
  void *p_local;
  
  local_30 = seed;
  _sum = p;
  for (local_2c = (uint)(bytes >> 2) & 0x3fffffff; local_2c != 0; local_2c = local_2c - 1) {
    uVar1 = archive_le32dec(_sum);
    local_30 = uVar1 ^ local_30;
    _sum = (void *)((long)_sum + 4);
  }
  return local_30;
}

Assistant:

static uint32_t
cab_checksum_cfdata_4(const void *p, size_t bytes, uint32_t seed)
{
	const unsigned char *b;
	unsigned u32num;
	uint32_t sum;

	u32num = (unsigned)bytes / 4;
	sum = seed;
	b = p;
	for (;u32num > 0; --u32num) {
		sum ^= archive_le32dec(b);
		b += 4;
	}
	return (sum);
}